

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeAndRehash_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeAndRehash_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *pBVar2;
  char *lhs_expression;
  unsigned_long *lhs;
  AssertHelper *this_00;
  AssertHelper *in_RDI;
  AssertionResult gtest_ar_2;
  int i_1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i;
  TypeParam ht;
  undefined4 in_stack_fffffffffffffd58;
  float in_stack_fffffffffffffd5c;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd60;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd68;
  hasher *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  int iVar3;
  HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffd80;
  Type type;
  Message *in_stack_fffffffffffffdd8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffde0;
  int local_1ac;
  AssertionResult local_188 [2];
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 uVar4;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffea0;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  AssertionResult local_158 [7];
  int local_e0;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_d0;
  Hasher local_c0;
  Hasher local_b4 [15];
  
  Hasher::Hasher(local_b4,0);
  Hasher::Hasher(&local_c0,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_d0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            (in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78,
             in_stack_fffffffffffffd70,(key_equal *)in_stack_fffffffffffffd68,
             (allocator_type *)in_stack_fffffffffffffd60);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::max_load_factor(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  for (local_e0 = 1; local_e0 < 100; local_e0 = local_e0 + 1) {
    HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffffd68,(int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffea0,
             (value_type *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xce9839);
  }
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize(in_stack_fffffffffffffd60,CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  pBVar2 = (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)google::
              BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xce98d1);
  uVar4 = 300;
  this_01 = pBVar2;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            (in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
             (unsigned_long *)in_stack_fffffffffffffd68,(uint *)in_stack_fffffffffffffd60);
  iVar3 = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    in_stack_fffffffffffffd80 =
         (HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xce9951);
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,(Type)((ulong)pBVar2 >> 0x20),(char *)in_stack_fffffffffffffd80,iVar3,
               (char *)in_stack_fffffffffffffd70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffde0._M_head_impl,in_stack_fffffffffffffdd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd60);
    testing::Message::~Message((Message *)0xce99ae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xce9a1f);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::rehash(in_stack_fffffffffffffd60,CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  lhs_expression =
       (char *)google::
               BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xce9a4b);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (lhs_expression,(char *)in_stack_fffffffffffffd70,(uint *)in_stack_fffffffffffffd68,
             (unsigned_long *)in_stack_fffffffffffffd60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    in_stack_fffffffffffffd70 =
         (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0xce9ad2);
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,(Type)((ulong)pBVar2 >> 0x20),(char *)in_stack_fffffffffffffd80,
               (int)((ulong)lhs_expression >> 0x20),(char *)in_stack_fffffffffffffd70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffde0._M_head_impl,in_stack_fffffffffffffdd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd60);
    testing::Message::~Message((Message *)0xce9b2f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xce9ba0);
  for (local_1ac = 0x65; type = (Type)((ulong)pBVar2 >> 0x20), local_1ac < 200;
      local_1ac = local_1ac + 1) {
    HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffffd68,(int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(this_01,(value_type *)CONCAT44(uVar4,in_stack_fffffffffffffe98));
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xce9c03);
  }
  lhs = (unsigned_long *)
        google::
        BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
        ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)0xce9c5b);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            (lhs_expression,(char *)in_stack_fffffffffffffd70,lhs,(uint *)in_stack_fffffffffffffd60)
  ;
  iVar3 = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdd8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xce9ccc)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_RDI,type,(char *)in_stack_fffffffffffffd80,iVar3,(char *)in_stack_fffffffffffffd70
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffde0._M_head_impl,in_stack_fffffffffffffdd8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xce9d1a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xce9d7f);
  google::
  HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xce9d8c);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeAndRehash) {
  // resize() and rehash() are synonyms.  rehash() is the tr1 name.
  TypeParam ht(10000);
  ht.max_load_factor(0.8f);  // for consistency's sake

  for (int i = 1; i < 100; ++i) ht.insert(this->UniqueObject(i));
  ht.resize(0);
  // Now ht should be as small as possible.
  EXPECT_LT(ht.bucket_count(), 300u);

  ht.rehash(9000);  // use the 'rehash' version of the name.
  // Bucket count should be next power of 2, after considering max_load_factor.
  EXPECT_EQ(16384u, ht.bucket_count());
  for (int i = 101; i < 200; ++i) ht.insert(this->UniqueObject(i));
  // Adding a few hundred buckets shouldn't have caused a resize yet.
  EXPECT_EQ(ht.bucket_count(), 16384u);
}